

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::~HttpChunkedEntityWriter
          (HttpChunkedEntityWriter *this)

{
  HttpOutputStream *this_00;
  bool bVar1;
  char (*params) [6];
  String local_40;
  HttpOutputStream *local_28;
  HttpOutputStream *inner;
  HttpChunkedEntityWriter *local_10;
  HttpChunkedEntityWriter *this_local;
  
  local_10 = this;
  bVar1 = HttpEntityBodyWriter::alreadyDone(&this->super_HttpEntityBodyWriter);
  if (!bVar1) {
    local_28 = HttpEntityBodyWriter::getInner(&this->super_HttpEntityBodyWriter);
    bVar1 = HttpOutputStream::canWriteBodyData(local_28);
    this_00 = local_28;
    if (bVar1) {
      str<char_const(&)[6]>(&local_40,(kj *)"0\r\n\r\n",params);
      HttpOutputStream::writeBodyData(this_00,&local_40);
      String::~String(&local_40);
      HttpEntityBodyWriter::doneWriting(&this->super_HttpEntityBodyWriter);
    }
  }
  HttpEntityBodyWriter::~HttpEntityBodyWriter(&this->super_HttpEntityBodyWriter);
  return;
}

Assistant:

~HttpChunkedEntityWriter() noexcept(false) {
    if (!alreadyDone()) {
      auto& inner = getInner();
      if (inner.canWriteBodyData()) {
        inner.writeBodyData(kj::str("0\r\n\r\n"));
        doneWriting();
      }
    }
  }